

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true> __thiscall
duckdb::DataTable::InitializeUpdate
          (DataTable *this,TableCatalogEntry *table,ClientContext *context,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints)

{
  _Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_> _Var1;
  DataTableInfo *table_info;
  element_type *peVar2;
  _Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_> _Var3;
  pointer pTVar4;
  pointer *__ptr;
  undefined8 in_R8;
  
  table_info = shared_ptr<duckdb::DataTableInfo,_true>::operator->
                         ((shared_ptr<duckdb::DataTableInfo,_true> *)
                          &(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.set)
  ;
  TableIndexList::InitializeIndexes
            (&table_info->indexes,(ClientContext *)bound_constraints,table_info,(char *)0x0);
  peVar2 = (element_type *)operator_new(8);
  *(undefined8 *)&(peVar2->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_ = 0;
  (this->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  _Var3.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::ConstraintState_*,_false>)operator_new(0x10);
  *(ClientContext **)_Var3.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
       context;
  *(undefined8 *)
   ((long)_Var3.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl + 8) = in_R8;
  pTVar4 = unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
           ::operator->((unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
                         *)this);
  _Var1.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
       (pTVar4->constraint_state).
       super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
       .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>;
  (pTVar4->constraint_state).
  super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>.
  super__Head_base<0UL,_duckdb::ConstraintState_*,_false> =
       _Var3.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl;
  if (_Var1.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl !=
      (ConstraintState *)0x0) {
    operator_delete((void *)_Var1.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>.
                            _M_head_impl);
  }
  return (unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>)
         (unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>)this;
}

Assistant:

unique_ptr<TableUpdateState> DataTable::InitializeUpdate(TableCatalogEntry &table, ClientContext &context,
                                                         const vector<unique_ptr<BoundConstraint>> &bound_constraints) {
	// check that there are no unknown indexes
	info->InitializeIndexes(context);

	auto result = make_uniq<TableUpdateState>();
	result->constraint_state = InitializeConstraintState(table, bound_constraints);
	return result;
}